

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint::clear_AudioFeaturePrintType
          (AudioFeaturePrint *this)

{
  AudioFeaturePrint_Sound *this_00;
  AudioFeaturePrintTypeCase AVar1;
  Arena *pAVar2;
  AudioFeaturePrint *this_local;
  
  AVar1 = AudioFeaturePrintType_case(this);
  if ((((AVar1 != AUDIOFEATUREPRINTTYPE_NOT_SET) && (AVar1 == kSound)) &&
      (pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite),
      pAVar2 == (Arena *)0x0)) &&
     (this_00 = (this->AudioFeaturePrintType_).sound_, this_00 != (AudioFeaturePrint_Sound *)0x0)) {
    AudioFeaturePrint_Sound::~AudioFeaturePrint_Sound(this_00);
    operator_delete(this_00,0x18);
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void AudioFeaturePrint::clear_AudioFeaturePrintType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.AudioFeaturePrint)
  switch (AudioFeaturePrintType_case()) {
    case kSound: {
      if (GetArenaForAllocation() == nullptr) {
        delete AudioFeaturePrintType_.sound_;
      }
      break;
    }
    case AUDIOFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = AUDIOFEATUREPRINTTYPE_NOT_SET;
}